

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O1

bool __thiscall
ON_SubDComponentRefList::Internal_UpdateCount
          (ON_SubDComponentRefList *this,ON_SubDComponentRef *r,int i)

{
  ON_SubDEdgeTag OVar1;
  bool bVar2;
  Type TVar3;
  ON_SubDVertex *pOVar4;
  ON_SubDEdge *pOVar5;
  ON_SubDFace *pOVar6;
  ON_SubD *this_00;
  ON_SubDComponentPtr cptr;
  ON_SubDComponentPtr local_20;
  
  this_00 = (r->m_subd_ref).m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (this_00 == (element_type *)0x0) {
    this_00 = &ON_SubD::Empty;
  }
  bVar2 = ON_SubD::IsEmpty(this_00);
  if (!bVar2) {
    local_20.m_ptr = (r->m_component_ptr).m_ptr;
    TVar3 = ON_SubDComponentPtr::ComponentType(&local_20);
    if (TVar3 == Face) {
      pOVar6 = ON_SubDComponentPtr::Face(&local_20);
      if (pOVar6 != (ON_SubDFace *)0x0) {
        this->m_subd_face_count = this->m_subd_face_count + i;
        return true;
      }
    }
    else if (TVar3 == Edge) {
      pOVar5 = ON_SubDComponentPtr::Edge(&local_20);
      if (pOVar5 != (ON_SubDEdge *)0x0) {
        OVar1 = pOVar5->m_edge_tag;
        if (OVar1 != SmoothX) {
          if (OVar1 == Crease) {
            this->m_subd_edge_crease_count = this->m_subd_edge_crease_count + i;
            return true;
          }
          if (OVar1 != Smooth) {
            return false;
          }
        }
        this->m_subd_edge_smooth_count = this->m_subd_edge_smooth_count + i;
        return true;
      }
    }
    else if ((TVar3 == Vertex) &&
            (pOVar4 = ON_SubDComponentPtr::Vertex(&local_20), pOVar4 != (ON_SubDVertex *)0x0)) {
      switch(pOVar4->m_vertex_tag) {
      case Smooth:
        this->m_subd_vertex_smooth_count = this->m_subd_vertex_smooth_count + i;
        break;
      case Crease:
        this->m_subd_vertex_crease_count = this->m_subd_vertex_crease_count + i;
        break;
      case Corner:
        this->m_subd_vertex_corner_count = this->m_subd_vertex_corner_count + i;
        break;
      case Dart:
        this->m_subd_vertex_dart_count = this->m_subd_vertex_dart_count + i;
        break;
      default:
        goto LAB_00635c0e;
      }
      return true;
    }
  }
LAB_00635c0e:
  return false;
}

Assistant:

bool ON_SubDComponentRefList::Internal_UpdateCount(const ON_SubDComponentRef& r, int i)
{
  if (r.SubD().IsEmpty())
    return false;

  bool rc = false;
  ON_SubDComponentPtr cptr = r.ComponentPtr();
  switch (cptr.ComponentType())
  {
      case ON_SubDComponentPtr::Type::Unset:
        break;
          
      case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* v = cptr.Vertex();
      if (nullptr == v)
        break;
      switch (v->m_vertex_tag)
      {
      case ON_SubDVertexTag::Smooth:
        m_subd_vertex_smooth_count += i;
        rc = true;
        break;
      case ON_SubDVertexTag::Crease:
        m_subd_vertex_crease_count += i;
        rc = true;
        break;
      case ON_SubDVertexTag::Corner:
        m_subd_vertex_corner_count += i;
        rc = true;
        break;
      case ON_SubDVertexTag::Dart:
        m_subd_vertex_dart_count += i;
        rc = true;
        break;
      case ON_SubDVertexTag::Unset:
        break;
      }
    }
    break;

  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* e = cptr.Edge();
      if (nullptr == e)
        break;
      switch (e->m_edge_tag)
      {
      case ON_SubDEdgeTag::Smooth:
      case ON_SubDEdgeTag::SmoothX:
        m_subd_edge_smooth_count += i;
        rc = true;
        break;
      case ON_SubDEdgeTag::Crease:
        m_subd_edge_crease_count += i;
        rc = true;
        break;
      case ON_SubDEdgeTag::Unset:
        break;
      }
    }
    break;

  case ON_SubDComponentPtr::Type::Face:
    if (nullptr != cptr.Face())
    {
      m_subd_face_count += i;
      rc = true;
    }
    break;
  }

  return rc;
}